

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall FIX::Acceptor::stop(Acceptor *this,bool force)

{
  size_t *this_00;
  Session *this_01;
  bool bVar1;
  pointer sessionID;
  SessionID *sessionID_00;
  reference ppSVar2;
  bool local_101;
  Session *session;
  iterator __end1;
  iterator __begin1;
  vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *__range1;
  int second;
  Session *local_88;
  Session *pSession;
  _Self local_78;
  iterator i;
  undefined1 local_60 [8];
  Sessions sessions;
  vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> enabledSessions;
  bool force_local;
  Acceptor *this_local;
  
  bVar1 = isStopped(this);
  if (!bVar1) {
    HttpServer::stopGlobal();
    std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::vector
              ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
               &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
    ::map((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
           *)local_60,&this->m_sessions);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
         ::begin((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                  *)local_60);
    while( true ) {
      pSession = (Session *)
                 std::
                 map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                 ::end((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                        *)local_60);
      bVar1 = std::operator!=(&local_78,(_Self *)&pSession);
      if (!bVar1) break;
      sessionID = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
                  operator->(&local_78);
      local_88 = Session::lookupSession(&sessionID->first);
      if ((local_88 != (Session *)0x0) && (bVar1 = Session::isEnabled(local_88), bVar1)) {
        std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::push_back
                  ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
                   &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_88);
        this_01 = local_88;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&second,"",(allocator<char> *)((long)&__range1 + 7));
        Session::logout(this_01,(string *)&second);
        std::__cxx11::string::~string((string *)&second);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        sessionID_00 = Session::getSessionID(local_88);
        Session::unregisterSession(sessionID_00);
      }
      std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator++
                (&local_78);
    }
    if (!force) {
      __range1._0_4_ = 1;
      while( true ) {
        local_101 = false;
        if ((int)__range1 < 0xb) {
          local_101 = isLoggedOn(this);
        }
        if (local_101 == false) break;
        process_sleep(1.0);
        __range1._0_4_ = (int)__range1 + 1;
      }
    }
    std::atomic<bool>::operator=(&this->m_stop,true);
    (*this->_vptr_Acceptor[6])();
    if (this->m_threadid != 0) {
      thread_join(this->m_threadid);
    }
    this->m_threadid = 0;
    this_00 = &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1 = std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::begin
                       ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)this_00);
    session = (Session *)
              std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::end
                        ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
                                       *)&session), bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
                ::operator*(&__end1);
      Session::logon(*ppSVar2);
      __gnu_cxx::
      __normal_iterator<FIX::Session_**,_std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>_>
      ::operator++(&__end1);
    }
    std::
    map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
    ::~map((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
            *)local_60);
    std::vector<FIX::Session_*,_std::allocator<FIX::Session_*>_>::~vector
              ((vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> *)
               &sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void Acceptor::stop(bool force) {
  if (isStopped()) {
    return;
  }

  HttpServer::stopGlobal();

  std::vector<Session *> enabledSessions;

  Sessions sessions = m_sessions;
  Sessions::iterator i = sessions.begin();
  for (; i != sessions.end(); ++i) {
    Session *pSession = Session::lookupSession(i->first);
    if (pSession && pSession->isEnabled()) {
      enabledSessions.push_back(pSession);
      pSession->logout();
      Session::unregisterSession(pSession->getSessionID());
    }
  }

  if (!force) {
    for (int second = 1; second <= 10 && isLoggedOn(); ++second) {
      process_sleep(1);
    }
  }

  m_stop = true;
  onStop();
  if (m_threadid) {
    thread_join(m_threadid);
  }
  m_threadid = 0;

  for (Session *session : enabledSessions) {
    session->logon();
  }
}